

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O3

Frag __thiscall re2::Compiler::Cat(Compiler *this,Frag a,Frag b)

{
  Inst *inst0;
  Frag FVar1;
  uint32_t p;
  uint32_t local_68;
  uint32_t uStack_64;
  uint32_t uStack_60;
  uint uStack_5c;
  uint32_t uStack_4c;
  uint32_t uStack_48;
  uint32_t uStack_3c;
  uint32_t local_38;
  
  uStack_3c = a.end.head;
  local_38 = a.end.tail;
  uStack_4c = b.end.head;
  uStack_48 = b.end.tail;
  local_68 = a.begin;
  p = b.begin;
  if (p == 0 || local_68 == 0) {
    local_68 = 0;
    uStack_64 = 0;
    uStack_60 = 0;
    uStack_5c = (uint)uStack_5c._1_3_ << 8;
  }
  else {
    inst0 = (this->inst_).ptr_._M_t.
            super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
            super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
            super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
    if ((((inst0[(int)local_68].out_opcode_ & 7) == 6) && (inst0[(int)local_68].out_opcode_ < 0x10))
       && (local_68 * 2 == uStack_3c)) {
      PatchList::Patch(inst0,a.end,p);
      uStack_5c = b._12_4_;
      local_68 = p;
      uStack_64 = uStack_4c;
      uStack_60 = uStack_48;
    }
    else if (this->reversed_ == true) {
      PatchList::Patch(inst0,b.end,local_68);
      uStack_64 = uStack_3c;
      uStack_60 = local_38;
      uStack_5c = CONCAT31(uStack_5c._1_3_,b.nullable & a.nullable) & 0xffffff01;
      local_68 = p;
    }
    else {
      PatchList::Patch(inst0,a.end,p);
      uStack_64 = uStack_4c;
      uStack_60 = uStack_48;
      uStack_5c = CONCAT31(uStack_5c._1_3_,a.nullable & b.nullable) & 0xffffff01;
    }
  }
  FVar1.end.head = uStack_64;
  FVar1.begin = local_68;
  FVar1.end.tail = uStack_60;
  FVar1._12_4_ = uStack_5c;
  return FVar1;
}

Assistant:

Frag Compiler::Cat(Frag a, Frag b) {
  if (IsNoMatch(a) || IsNoMatch(b))
    return NoMatch();

  // Elide no-op.
  Prog::Inst* begin = &inst_[a.begin];
  if (begin->opcode() == kInstNop &&
      a.end.head == (a.begin << 1) &&
      begin->out() == 0) {
    // in case refs to a somewhere
    PatchList::Patch(inst_.data(), a.end, b.begin);
    return b;
  }

  // To run backward over string, reverse all concatenations.
  if (reversed_) {
    PatchList::Patch(inst_.data(), b.end, a.begin);
    return Frag(b.begin, a.end, b.nullable && a.nullable);
  }

  PatchList::Patch(inst_.data(), a.end, b.begin);
  return Frag(a.begin, b.end, a.nullable && b.nullable);
}